

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::decode_url(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int i;
  int iVar10;
  bool bVar11;
  bool bVar12;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  char buff [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar10 = 0;
  do {
    lVar4 = (long)iVar10;
    pcVar1 = (s->_M_dataplus)._M_p;
    cVar7 = pcVar1[lVar4];
    cVar5 = (char)__return_storage_ptr__;
    if (cVar7 == '%') {
      if (pcVar1[lVar4 + 1] == 'u') {
        cVar7 = pcVar1[lVar4 + 2];
        if (cVar7 == '\0') {
          uVar3 = 0;
          bVar12 = false;
        }
        else {
          bVar12 = false;
          lVar6 = 1;
          uVar3 = 0;
          do {
            iVar8 = (int)cVar7;
            uVar9 = iVar8 - 0x30;
            bVar11 = true;
            if (cVar7 < ' ' || 9 < uVar9) {
              if ((byte)(cVar7 + 0xbfU) < 6) {
                uVar9 = iVar8 - 0x37;
              }
              else {
                uVar9 = iVar8 - 0x57;
                bVar11 = (byte)(cVar7 + 0x9fU) < 6;
                if (!bVar11) {
                  uVar9 = 0;
                }
              }
            }
            if (!bVar11) break;
            uVar3 = (ulong)(uVar9 + (int)uVar3 * 0x10);
            bVar12 = (int)lVar6 == 4;
            if (bVar12) break;
            cVar7 = pcVar1[lVar6 + lVar4 + 2];
            lVar6 = lVar6 + 1;
          } while (cVar7 != '\0');
        }
        if (bVar12) {
          iVar8 = (int)uVar3;
          bVar2 = (byte)uVar3;
          if (iVar8 < 0x80) {
            local_34 = bVar2 & 0x7f;
LAB_0011b157:
            bVar12 = false;
          }
          else {
            if (iVar8 < 0x800) {
              local_34 = (byte)(uVar3 >> 6) & 0x1f | 0xc0;
              local_33 = bVar2 & 0x3f | 0x80;
              goto LAB_0011b157;
            }
            if (iVar8 < 0xd800) {
LAB_0011b131:
              local_34 = (byte)(uVar3 >> 0xc) & 0xf | 0xe0;
              local_33 = (byte)(uVar3 >> 6) & 0x3f | 0x80;
              local_32 = bVar2 & 0x3f | 0x80;
              goto LAB_0011b157;
            }
            bVar12 = true;
            if (0xdfff < iVar8) {
              if (iVar8 < 0x10000) goto LAB_0011b131;
              if (iVar8 < 0x110000) {
                local_34 = (byte)(uVar3 >> 0x12) & 7 | 0xf0;
                local_33 = (byte)(uVar3 >> 0xc) & 0x3f | 0x80;
                local_32 = (byte)(uVar3 >> 6) & 0x3f | 0x80;
                local_31 = bVar2 & 0x3f | 0x80;
                goto LAB_0011b157;
              }
            }
          }
          if (!bVar12) {
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_34);
          }
          iVar10 = iVar10 + 5;
        }
        else {
          std::__cxx11::string::push_back(cVar5);
        }
      }
      else {
        cVar7 = pcVar1[lVar4 + 1];
        if (cVar7 == '\0') {
          bVar12 = false;
        }
        else {
          lVar6 = 0;
          bVar12 = false;
          do {
            bVar11 = true;
            if ((cVar7 < ' ' || 9 < (int)cVar7 - 0x30U) && (5 < (byte)(cVar7 + 0xbfU))) {
              bVar11 = (byte)(cVar7 + 0x9fU) < 6;
            }
            if ((!bVar11) || (bVar12 = (int)lVar6 == 1, bVar12)) break;
            cVar7 = pcVar1[lVar6 + lVar4 + 2];
            lVar6 = lVar6 + 1;
          } while (cVar7 != '\0');
        }
        if (bVar12) {
          std::__cxx11::string::push_back(cVar5);
          iVar10 = iVar10 + 2;
        }
        else {
          std::__cxx11::string::push_back(cVar5);
        }
      }
    }
    else {
      if ((cVar7 != '+') && (cVar7 == '\0')) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back(cVar5);
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

inline std::string decode_url(const std::string& s)
{
    std::string result;

    for (int i = 0; s[i]; i++) {
        if (s[i] == '%') {
            if (s[i + 1] && s[i + 1] == 'u') {
                int val = 0;
                if (from_hex_to_i(s, i + 2, 4, val)) {
                    // 4 digits Unicode codes
                    char buff[4];
                    size_t len = to_utf8(val, buff);
                    if (len > 0) {
                        result.append(buff, len);
                    }
                    i += 5; // 'u0000'
                } else {
                    result += s[i];
                }
            } else {
                int val = 0;
                if (from_hex_to_i(s, i + 1, 2, val)) {
                    // 2 digits hex codes
                    result += val;
                    i += 2; // '00'
                } else {
                    result += s[i];
                }
            }
        } else if (s[i] == '+') {
            result += ' ';
        } else {
            result += s[i];
        }
    }

    return result;
}